

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManTransformTwoWord2DualOutput(Gia_Man_t *p)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  Gia_Man_t *p_00;
  size_t sVar9;
  char *pcVar10;
  Vec_Int_t *pVVar11;
  Gia_Obj_t *pGVar12;
  ulong uVar13;
  Gia_Man_t *pGVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  
  uVar6 = p->vCos->nSize - p->nRegs;
  if ((uVar6 & 1) != 0) {
    __assert_fail("(Gia_ManPoNum(p) & 1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0xbce,"Gia_Man_t *Gia_ManTransformTwoWord2DualOutput(Gia_Man_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar3);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar3);
  }
  p_00->pName = pcVar10;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar3);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar3);
  }
  p_00->pSpec = pcVar10;
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    lVar17 = 0;
    do {
      iVar7 = pVVar11->pArray[lVar17];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_001ea691;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar12 = Gia_ManAppendObj(p_00);
      uVar13 = *(ulong *)pGVar12;
      *(ulong *)pGVar12 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar12 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p_00->pObjs;
      if ((pGVar12 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar12)) {
LAB_001ea6b0:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar12 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar12)) goto LAB_001ea6b0;
      pGVar4[iVar7].Value = (int)((ulong)((long)pGVar12 - (long)pGVar5) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
      pVVar11 = p->vCis;
    } while (lVar17 < pVVar11->nSize);
  }
  if (0 < p->nObjs) {
    lVar19 = 8;
    lVar17 = 0;
    do {
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar13 = *(ulong *)((long)pGVar4 + lVar19 + -8);
      if ((uVar13 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar13) {
        uVar1 = *(uint *)((long)pGVar4 +
                         lVar19 + (ulong)(uint)((int)(uVar13 & 0x1fffffff) << 2) * -3);
        if (((int)uVar1 < 0) ||
           (uVar8 = *(uint *)((long)pGVar4 +
                             lVar19 + (ulong)((uint)(uVar13 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar8 < 0)) goto LAB_001ea6cf;
        iVar7 = Gia_ManHashAnd(p_00,uVar1 ^ (uint)(uVar13 >> 0x1d) & 1,
                               uVar8 ^ (uint)(uVar13 >> 0x3d) & 1);
        *(int *)(&pGVar4->field_0x0 + lVar19) = iVar7;
      }
      lVar17 = lVar17 + 1;
      lVar19 = lVar19 + 0xc;
    } while (lVar17 < p->nObjs);
  }
  pVVar11 = p->vCos;
  uVar1 = pVVar11->nSize;
  uVar15 = (ulong)uVar1;
  uVar8 = uVar1 - p->nRegs;
  uVar13 = (ulong)uVar8;
  if (uVar8 != 0 && p->nRegs <= (int)uVar1) {
    lVar17 = (long)((int)uVar6 / 2);
    uVar18 = 0;
    do {
      if ((long)(int)uVar15 <= (long)uVar18) goto LAB_001ea6ee;
      iVar7 = pVVar11->pArray[uVar18];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) goto LAB_001ea691;
      if (((uint)((int)uVar6 / 2) == uVar18) || (pGVar4 = p->pObjs, pGVar4 == (Gia_Obj_t *)0x0))
      break;
      if ((int)uVar13 <= lVar17) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (((int)uVar6 < -1) || ((int)uVar15 <= lVar17)) goto LAB_001ea6ee;
      iVar16 = pVVar11->pArray[lVar17];
      if (((long)iVar16 < 0) || (p->nObjs <= iVar16)) goto LAB_001ea691;
      uVar8 = (uint)*(undefined8 *)(pGVar4 + iVar7);
      uVar1 = (pGVar4 + iVar7)[-(ulong)(uVar8 & 0x1fffffff)].Value;
      if ((int)uVar1 < 0) goto LAB_001ea6cf;
      Gia_ManAppendCo(p_00,uVar8 >> 0x1d & 1 ^ uVar1);
      uVar8 = (uint)*(undefined8 *)(pGVar4 + iVar16);
      uVar1 = (pGVar4 + iVar16)[-(ulong)(uVar8 & 0x1fffffff)].Value;
      if ((int)uVar1 < 0) goto LAB_001ea6cf;
      Gia_ManAppendCo(p_00,uVar8 >> 0x1d & 1 ^ uVar1);
      uVar18 = uVar18 + 1;
      pVVar11 = p->vCos;
      uVar15 = (ulong)pVVar11->nSize;
      uVar13 = uVar15 - (long)p->nRegs;
      lVar17 = lVar17 + 1;
    } while ((long)uVar18 < (long)uVar13);
  }
  iVar7 = p->nRegs;
  if (0 < iVar7) {
    iVar16 = 0;
    do {
      iVar2 = p->vCos->nSize;
      uVar6 = (iVar2 - iVar7) + iVar16;
      if (((int)uVar6 < 0) || (iVar2 <= (int)uVar6)) {
LAB_001ea6ee:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar7 = p->vCos->pArray[uVar6];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
LAB_001ea691:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar7;
      if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0) {
LAB_001ea6cf:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar6 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
                                   pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value)
      ;
      pGVar4->Value = uVar6;
      iVar16 = iVar16 + 1;
      iVar7 = p->nRegs;
    } while (iVar16 < iVar7);
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  pGVar14 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar14;
}

Assistant:

Gia_Man_t * Gia_ManTransformTwoWord2DualOutput( Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObj2;
    int i, nPart = Gia_ManPoNum(p)/2;
    assert( (Gia_ManPoNum(p) & 1) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
    {
        if ( i == nPart )
            break;
        pObj2 = Gia_ManPo( p, nPart + i );
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj2) );
    }
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}